

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall c4::yml::Tree::root_id(Tree *this)

{
  code *pcVar1;
  Location loc;
  bool bVar2;
  error_flags eVar3;
  size_t sVar4;
  
  if (this->m_cap == 0) {
    reserve(this,0x10);
    bVar2 = this->m_cap == 0;
  }
  else {
    bVar2 = false;
  }
  if ((bVar2) || (this->m_size == 0)) {
    eVar3 = get_error_flags();
    if ((eVar3 & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        sVar4 = (*pcVar1)();
        return sVar4;
      }
    }
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x4b89) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x4b89) << 0x40,8);
    loc.name.str = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc.name.len = 0x65;
    error("check failed: m_cap > 0 && m_size > 0",0x25,loc);
  }
  return 0;
}

Assistant:

size_t root_id()       { if(m_cap == 0) { reserve(16); } RYML_ASSERT(m_cap > 0 && m_size > 0); return 0; }